

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt32 * tt_cmap14_char_variants(TT_CMap cmap,FT_Memory memory,FT_UInt32 charCode)

{
  byte bVar1;
  byte bVar2;
  FT_Byte *pFVar3;
  FT_UInt32 FVar4;
  FT_Error FVar5;
  FT_UInt FVar6;
  ulong uVar7;
  ulong uVar8;
  FT_ULong nondefOff;
  FT_ULong defOff;
  FT_CMap_Class pFStack_48;
  FT_UInt32 varSel;
  FT_UInt32 *q;
  FT_Byte *p;
  FT_UInt32 count;
  TT_CMap14 cmap14;
  FT_UInt32 charCode_local;
  FT_Memory memory_local;
  TT_CMap cmap_local;
  
  p._4_4_ = (int)cmap[1].cmap.charmap.face;
  pFVar3 = cmap->data;
  FVar5 = tt_cmap14_ensure((TT_CMap14)cmap,p._4_4_ + 1,memory);
  if (FVar5 == 0) {
    pFStack_48 = cmap[1].cmap.clazz;
    q = (FT_UInt32 *)(pFVar3 + 10);
    for (; p._4_4_ != 0; p._4_4_ = p._4_4_ + -1) {
      FVar4 = *q;
      bVar1 = *(byte *)((long)q + 1);
      bVar2 = *(byte *)((long)q + 2);
      uVar7 = (ulong)((uint)*(byte *)((long)q + 3) << 0x18 | (uint)(byte)q[1] << 0x10 |
                      (uint)*(byte *)((long)q + 5) << 8 | (uint)*(byte *)((long)q + 6));
      uVar8 = (ulong)((uint)*(byte *)((long)q + 7) << 0x18 | (uint)(byte)q[2] << 0x10 |
                      (uint)*(byte *)((long)q + 9) << 8 | (uint)*(byte *)((long)q + 10));
      if (uVar7 == 0) {
LAB_0018b83f:
        if (uVar8 != 0) {
          FVar6 = tt_cmap14_char_map_nondef_binary(cmap->data + uVar8,charCode);
          if (FVar6 != 0) goto LAB_0018b85f;
        }
      }
      else {
        FVar6 = tt_cmap14_char_map_def_binary(cmap->data + uVar7,charCode);
        if (FVar6 == 0) goto LAB_0018b83f;
LAB_0018b85f:
        *(uint *)&pFStack_48->size = (uint)(byte)FVar4 << 0x10 | (uint)bVar1 << 8 | (uint)bVar2;
        pFStack_48 = (FT_CMap_Class)((long)&pFStack_48->size + 4);
      }
      q = (FT_UInt32 *)((long)q + 0xb);
    }
    *(undefined4 *)&pFStack_48->size = 0;
    cmap_local = (TT_CMap)cmap[1].cmap.clazz;
  }
  else {
    cmap_local = (TT_CMap)0x0;
  }
  return (FT_UInt32 *)cmap_local;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 * )
  tt_cmap14_char_variants( TT_CMap    cmap,
                           FT_Memory  memory,
                           FT_UInt32  charCode )
  {
    TT_CMap14   cmap14 = (TT_CMap14)  cmap;
    FT_UInt32   count  = cmap14->num_selectors;
    FT_Byte*    p      = cmap->data + 10;
    FT_UInt32*  q;


    if ( tt_cmap14_ensure( cmap14, ( count + 1 ), memory ) )
      return NULL;

    for ( q = cmap14->results; count > 0; count-- )
    {
      FT_UInt32  varSel    = TT_NEXT_UINT24( p );
      FT_ULong   defOff    = TT_NEXT_ULONG( p );
      FT_ULong   nondefOff = TT_NEXT_ULONG( p );


      if ( ( defOff != 0                                               &&
             tt_cmap14_char_map_def_binary( cmap->data + defOff,
                                            charCode )                 ) ||
           ( nondefOff != 0                                            &&
             tt_cmap14_char_map_nondef_binary( cmap->data + nondefOff,
                                               charCode ) != 0         ) )
      {
        q[0] = varSel;
        q++;
      }
    }
    q[0] = 0;

    return cmap14->results;
  }